

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderFragDataTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderFragDataTests::init(ShaderFragDataTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  FragDataIndexingCase *pFVar2;
  pointer ppTVar3;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> negativeCases;
  ShaderLibrary library;
  
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_static_index",
             "Valid gl_FragData[] assignment using static index",INDEX_EXPR_STATIC);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_uniform_index",
             "Valid gl_FragData[] assignment using uniform index",INDEX_EXPR_UNIFORM);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_dynamic_index",
             "Valid gl_FragData[] assignment using dynamic index",INDEX_EXPR_DYNAMIC);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&library,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile(&negativeCases,&library,"shaders/fragdata.test");
  for (ppTVar3 = negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    tcu::TestNode::addChild((TestNode *)this,*ppTVar3);
  }
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  deqp::gls::ShaderLibrary::~ShaderLibrary(&library);
  return extraout_EAX;
}

Assistant:

void ShaderFragDataTests::init (void)
{
	addChild(new FragDataIndexingCase(m_context, "valid_static_index",	"Valid gl_FragData[] assignment using static index",	INDEX_EXPR_STATIC));
	addChild(new FragDataIndexingCase(m_context, "valid_uniform_index",	"Valid gl_FragData[] assignment using uniform index",	INDEX_EXPR_UNIFORM));
	addChild(new FragDataIndexingCase(m_context, "valid_dynamic_index",	"Valid gl_FragData[] assignment using dynamic index",	INDEX_EXPR_DYNAMIC));

	// Negative cases.
	{
		gls::ShaderLibrary library(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::vector<tcu::TestNode*> negativeCases = library.loadShaderFile("shaders/fragdata.test");

		for (std::vector<tcu::TestNode*>::iterator i = negativeCases.begin(); i != negativeCases.end(); i++)
			addChild(*i);
	}
}